

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::nextLogon(Session *this,Message *logon,UtcTimeStamp *now)

{
  Header *this_00;
  SessionState *this_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  SEQNUM SVar5;
  ostream *poVar6;
  UInt64Field *this_02;
  IntTConvertor<unsigned_long> *pIVar7;
  unsigned_long value;
  unsigned_long value_00;
  unsigned_long value_01;
  unsigned_long value_02;
  uchar *in_R8;
  size_t in_R9;
  string sStack_2e8;
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  stringstream stream;
  ostream local_258 [376];
  NextExpectedMsgSeqNum nextExpectedMsgSeqNum;
  ResetSeqNumFlag resetSeqNumFlag;
  
  this_00 = &logon->m_header;
  FieldMap::getField<FIX::SenderCompID>(&this_00->super_FieldMap);
  FieldMap::getField<FIX::TargetCompID>(&this_00->super_FieldMap);
  if (this->m_refreshOnLogon == true) {
    SessionState::refresh(&this->m_state);
  }
  if ((this->m_state).m_enabled == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stream,"Session is not enabled for logon",
               (allocator<char> *)&resetSeqNumFlag);
    SessionState::onEvent(&this->m_state,(string *)&stream);
LAB_001ade09:
    std::__cxx11::string::~string((string *)&stream);
    disconnect(this);
    return;
  }
  bVar1 = TimeRange::isInRange(&this->m_logonTime,now);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stream,"Received logon outside of valid logon time",
               (allocator<char> *)&resetSeqNumFlag);
    SessionState::onEvent(&this->m_state,(string *)&stream);
    goto LAB_001ade09;
  }
  stream = (stringstream)0x0;
  ResetSeqNumFlag::ResetSeqNumFlag(&resetSeqNumFlag,(BOOLEAN *)&stream);
  FieldMap::getFieldIfSet(&logon->super_FieldMap,(FieldBase *)&resetSeqNumFlag);
  bVar1 = BoolField::getValue(&resetSeqNumFlag.super_BoolField);
  this_01 = &this->m_state;
  (this->m_state).m_receivedReset = bVar1;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stream,"Logon contains ResetSeqNumFlag=Y, reseting sequence numbers to 1",
               (allocator<char> *)&nextExpectedMsgSeqNum);
    SessionState::onEvent(this_01,(string *)&stream);
    std::__cxx11::string::~string((string *)&stream);
    if ((this->m_state).m_sentReset == false) {
      std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&stream,&this->m_timestamper);
      SessionState::reset(this_01,(UtcTimeStamp *)&stream);
    }
  }
  bVar1 = (this->m_state).m_initiate;
  if (((bVar1 == true) && (((this->m_state).m_sentLogon & 1U) == 0)) &&
     ((this->m_state).m_receivedReset == false)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stream,"Received logon response before sending request",
               (allocator<char> *)&nextExpectedMsgSeqNum);
    SessionState::onEvent(this_01,(string *)&stream);
    std::__cxx11::string::~string((string *)&stream);
    disconnect(this);
    goto LAB_001ae213;
  }
  if ((bVar1 == false) && (this->m_resetOnLogon == true)) {
    std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&stream,&this->m_timestamper);
    SessionState::reset(this_01,(UtcTimeStamp *)&stream);
  }
  iVar3 = verify(this,(EVP_PKEY_CTX *)logon,(uchar *)0x0,1,in_R8,in_R9);
  if ((char)iVar3 == '\0') goto LAB_001ae213;
  (this->m_state).m_receivedLogon = true;
  NextExpectedMsgSeqNum::NextExpectedMsgSeqNum(&nextExpectedMsgSeqNum);
  bVar1 = FieldMap::getFieldIfSet(&logon->super_FieldMap,(FieldBase *)&nextExpectedMsgSeqNum);
  if (bVar1) {
    uVar4 = UInt64Field::getValue(&nextExpectedMsgSeqNum.super_SeqNumField);
    SVar5 = SessionState::getNextSenderMsgSeqNum(this_01);
    bVar1 = true;
    if (uVar4 < SVar5) goto LAB_001ade6b;
    uVar4 = UInt64Field::getValue(&nextExpectedMsgSeqNum.super_SeqNumField);
    SVar5 = SessionState::getNextSenderMsgSeqNum(this_01);
    if (uVar4 <= SVar5) goto LAB_001ade69;
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar6 = std::operator<<(local_258,"NextExpectedMsgSeqNum too high, expecting ");
    SessionState::getNextSenderMsgSeqNum(this_01);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," but received ");
    std::operator<<(poVar6,(string *)
                           &nextExpectedMsgSeqNum.super_SeqNumField.super_FieldBase.m_string);
    std::__cxx11::stringbuf::str();
    SessionState::onEvent(this_01,&sStack_2e8);
    std::__cxx11::string::~string((string *)&sStack_2e8);
    std::__cxx11::stringbuf::str();
    generateLogout(this,&sStack_2e8);
    std::__cxx11::string::~string((string *)&sStack_2e8);
    disconnect(this);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  else {
LAB_001ade69:
    bVar1 = false;
LAB_001ade6b:
    if (((this->m_state).m_initiate == true) &&
       (((this->m_state).m_receivedReset != true || ((this->m_state).m_sentReset != false)))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stream,"Received logon response",(allocator<char> *)&sStack_2e8);
      SessionState::onEvent(this_01,(string *)&stream);
    }
    else {
      FieldMap::getFieldIfSet(&logon->super_FieldMap,(FieldBase *)&(this->m_state).m_heartBtInt);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stream,"Received logon request",(allocator<char> *)&sStack_2e8);
      SessionState::onEvent(this_01,(string *)&stream);
      std::__cxx11::string::~string((string *)&stream);
      generateLogon(this,logon);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stream,"Responding to logon request",(allocator<char> *)&sStack_2e8);
      SessionState::onEvent(this_01,(string *)&stream);
    }
    std::__cxx11::string::~string((string *)&stream);
    (this->m_state).m_sentReset = false;
    (this->m_state).m_receivedReset = false;
    this_02 = &FieldMap::getField<FIX::MsgSeqNum>(&this_00->super_FieldMap)->super_SeqNumField;
    bVar2 = isTargetTooHigh(this,(MsgSeqNum *)this_02);
    if ((!bVar2) || (bVar2 = BoolField::getValue(&resetSeqNumFlag.super_BoolField), bVar2)) {
      SessionState::incrNextTargetMsgSeqNum(this_01);
      nextQueued(this,now);
    }
    else if (this->m_sendNextExpectedMsgSeqNum == true) {
      pIVar7 = (IntTConvertor<unsigned_long> *)SessionState::getNextTargetMsgSeqNum(this_01);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_2a8,pIVar7,value_01);
      std::operator+(&local_288,"Expecting retransmits FROM: ",&local_2a8);
      std::operator+(&sStack_2e8,&local_288," TO: ");
      uVar4 = UInt64Field::getValue(this_02);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                (&local_2c8,(IntTConvertor<unsigned_long> *)(uVar4 - 1),value_02);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                     &sStack_2e8,&local_2c8);
      SessionState::onEvent(this_01,(string *)&stream);
      std::__cxx11::string::~string((string *)&stream);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&sStack_2e8);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      uVar4 = UInt64Field::getValue(this_02);
      SessionState::queue(this_01,uVar4,logon);
      SVar5 = SessionState::getNextTargetMsgSeqNum(this_01);
      uVar4 = UInt64Field::getValue(this_02);
      (this->m_state).m_resendRange.first = SVar5;
      (this->m_state).m_resendRange.second = uVar4 - 1;
    }
    else {
      doTargetTooHigh(this,logon);
    }
    if (((this->m_state).m_receivedLogon == true) && (((this->m_state).m_sentLogon & 1U) != 0)) {
      (**(code **)(*(long *)this->m_application + 0x18))(this->m_application,&this->m_sessionID);
    }
    if (bVar1) {
      Mutex::lock(&this->m_mutex);
      pIVar7 = (IntTConvertor<unsigned_long> *)
               UInt64Field::getValue(&nextExpectedMsgSeqNum.super_SeqNumField);
      SVar5 = SessionState::getNextSenderMsgSeqNum(this_01);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_2a8,pIVar7,value);
      std::operator+(&local_288,
                     "Sending retransmits due to received NextExpectedMsgSeqNum is too low. FROM: ",
                     &local_2a8);
      std::operator+(&sStack_2e8,&local_288," TO: ");
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                (&local_2c8,(IntTConvertor<unsigned_long> *)(SVar5 - 1),value_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                     &sStack_2e8,&local_2c8);
      SessionState::onEvent(this_01,(string *)&stream);
      std::__cxx11::string::~string((string *)&stream);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&sStack_2e8);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      if (this->m_persistMessages == false) {
        EndSeqNo::EndSeqNo((EndSeqNo *)&stream,SVar5);
        uVar4 = UInt64Field::getValue((UInt64Field *)&stream);
        FieldBase::~FieldBase((FieldBase *)&stream);
        SVar5 = SessionState::getNextSenderMsgSeqNum(this_01);
        if (SVar5 < uVar4) {
          EndSeqNo::EndSeqNo((EndSeqNo *)&stream,SVar5);
          uVar4 = UInt64Field::getValue((UInt64Field *)&stream);
          FieldBase::~FieldBase((FieldBase *)&stream);
        }
        generateSequenceReset(this,(SEQNUM)pIVar7,uVar4);
      }
      else {
        generateRetransmits(this,(SEQNUM)pIVar7,SVar5 - 1);
      }
      Mutex::unlock(&this->m_mutex);
    }
  }
  FieldBase::~FieldBase((FieldBase *)&nextExpectedMsgSeqNum);
LAB_001ae213:
  FieldBase::~FieldBase((FieldBase *)&resetSeqNumFlag);
  return;
}

Assistant:

void Session::nextLogon(const Message &logon, const UtcTimeStamp &now) {
  logon.getHeader().getField<SenderCompID>();
  logon.getHeader().getField<TargetCompID>();

  if (m_refreshOnLogon) {
    refresh();
  }

  if (!isEnabled()) {
    m_state.onEvent("Session is not enabled for logon");
    disconnect();
    return;
  }

  if (!isLogonTime(now)) {
    m_state.onEvent("Received logon outside of valid logon time");
    disconnect();
    return;
  }

  ResetSeqNumFlag resetSeqNumFlag(false);
  logon.getFieldIfSet(resetSeqNumFlag);
  m_state.receivedReset(resetSeqNumFlag);

  if (m_state.receivedReset()) {
    m_state.onEvent("Logon contains ResetSeqNumFlag=Y, reseting sequence numbers to 1");
    if (!m_state.sentReset()) {
      m_state.reset(m_timestamper());
    }
  }

  if (m_state.shouldSendLogon() && !m_state.receivedReset()) {
    m_state.onEvent("Received logon response before sending request");
    disconnect();
    return;
  }

  if (!m_state.initiate() && m_resetOnLogon) {
    m_state.reset(m_timestamper());
  }

  if (!verify(logon, false, true)) {
    return;
  }
  m_state.receivedLogon(true);

  bool sendRetransmitsAfterLogon = false;
  NextExpectedMsgSeqNum nextExpectedMsgSeqNum;
  if (logon.getFieldIfSet(nextExpectedMsgSeqNum)) {
    if (nextExpectedMsgSeqNum.getValue() < getExpectedSenderNum()) {
      sendRetransmitsAfterLogon = true;
    } else if (nextExpectedMsgSeqNum.getValue() > getExpectedSenderNum()) {
      std::stringstream stream;
      stream << "NextExpectedMsgSeqNum too high, expecting " << getExpectedSenderNum() << " but received "
             << nextExpectedMsgSeqNum;
      m_state.onEvent(stream.str());
      generateLogout(stream.str());
      disconnect();
      return;
    }
  }

  if (!m_state.initiate() || (m_state.receivedReset() && !m_state.sentReset())) {
    logon.getFieldIfSet(m_state.heartBtInt());
    m_state.onEvent("Received logon request");
    generateLogon(logon);
    m_state.onEvent("Responding to logon request");
  } else {
    m_state.onEvent("Received logon response");
  }

  m_state.sentReset(false);
  m_state.receivedReset(false);

  auto const &msgSeqNum = logon.getHeader().getField<MsgSeqNum>();
  if (isTargetTooHigh(msgSeqNum) && !resetSeqNumFlag) {
    if (m_sendNextExpectedMsgSeqNum) {
      m_state.onEvent(
          "Expecting retransmits FROM: " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum())
          + " TO: " + SEQNUM_CONVERTOR::convert(msgSeqNum - 1));
      m_state.queue(msgSeqNum, logon);
      m_state.resendRange(getExpectedTargetNum(), msgSeqNum - 1);
    } else {
      doTargetTooHigh(logon);
    }
  } else {
    m_state.incrNextTargetMsgSeqNum();
    nextQueued(now);
  }

  if (isLoggedOn()) {
    m_application.onLogon(m_sessionID);
  }

  if (sendRetransmitsAfterLogon) {
    Locker l(m_mutex);

    auto beginSeqNo = nextExpectedMsgSeqNum.getValue();
    auto endSeqNo = getExpectedSenderNum() - 1;
    m_state.onEvent(
        "Sending retransmits due to received NextExpectedMsgSeqNum is too low. FROM: "
        + SEQNUM_CONVERTOR::convert(beginSeqNo) + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

    if (!m_persistMessages) {
      endSeqNo = EndSeqNo(endSeqNo + 1);
      auto next = m_state.getNextSenderMsgSeqNum();
      if (endSeqNo > next) {
        endSeqNo = EndSeqNo(next);
      }
      generateSequenceReset(beginSeqNo, endSeqNo);
    } else {
      generateRetransmits(beginSeqNo, endSeqNo);
    }
  }
}